

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManComputeMapping(Mf_Man_t *p)

{
  uint uVar1;
  Mf_Obj_t *pMVar2;
  float fVar3;
  uint *__src;
  int iVar4;
  int iVar5;
  int i;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  char *pTitle;
  uint *pCut;
  ulong uVar8;
  uint *pCut_00;
  ulong __n;
  float fVar9;
  uint local_384;
  int Time;
  uint local_374;
  uint *local_370;
  int local_368;
  int local_364;
  ulong local_360;
  uint *local_358;
  long local_350;
  uint *local_348;
  Mf_Obj_t *local_340;
  undefined1 local_338 [776];
  
  uVar8 = 0;
  do {
    if ((long)p->pGia->nObjs <= (long)uVar8) {
      Mf_ManSetMapRefs(p);
      if (p->fUseEla == 0) {
        pTitle = "Area ";
        if (p->Iter == 0) {
          pTitle = "Delay";
        }
      }
      else {
        pTitle = "Ela  ";
      }
      Mf_ManPrintStats(p,pTitle);
      return;
    }
    iVar5 = (int)uVar8;
    pGVar6 = Gia_ManObj(p->pGia,iVar5);
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      local_350 = uVar8 * 0x10;
      pMVar2 = p->pLfObjs;
      local_370 = (uint *)Mf_ObjCutSet(p,iVar5);
      Time = 0;
      iVar4 = -1;
      if ((p->fUseEla != 0) && (0xffff < *(uint *)&pMVar2[uVar8].field_0xc)) {
        piVar7 = Mf_ObjCutSet(p,iVar5);
        iVar4 = Mf_CutDeref_rec(p,piVar7 + 1);
      }
      pCut = local_370 + 1;
      pCut_00 = (uint *)0x0;
      local_384 = 1000000000;
      fVar3 = 1e+09;
      local_368 = iVar4;
      local_360 = uVar8;
      local_348 = pCut;
      local_340 = pMVar2 + uVar8;
      for (iVar5 = 0; pMVar2 = local_340, __src = local_348, uVar8 = local_360,
          iVar5 < (int)*local_370; iVar5 = iVar5 + 1) {
        if (((*pCut & 0x1f) == 1) && (local_360 == pCut[1])) {
          __assert_fail("!Mf_CutIsTriv(pCut, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaMf.c"
                        ,0x64f,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->pPars->nLutSize < (int)(*pCut & 0x1f)) {
          __assert_fail("Mf_CutSize(pCut) <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaMf.c"
                        ,0x650,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->fUseEla == 0) {
          fVar9 = Mf_CutFlow(p,(int *)pCut,&Time);
        }
        else {
          (p->vTemp).nSize = 0;
          local_364 = iVar5;
          iVar5 = Mf_CutRef2_rec(p,(int *)pCut,&p->vTemp,8);
          for (iVar4 = 0; iVar4 < (p->vTemp).nSize; iVar4 = iVar4 + 1) {
            i = Vec_IntEntry(&p->vTemp,iVar4);
            Mf_ObjMapRefDec(p,i);
          }
          fVar9 = (float)iVar5;
          iVar5 = local_364;
        }
        if (((pCut_00 == (uint *)0x0) || (fVar9 + 0.005 < fVar3)) ||
           (Time < (int)local_384 && fVar9 + -0.005 < fVar3)) {
          local_384 = Time;
          pCut_00 = pCut;
          fVar3 = fVar9;
        }
        pCut = pCut + (ulong)(*pCut & 0x1f) + 1;
      }
      local_374 = local_384;
      if (pCut_00 == (uint *)0x0) {
        __assert_fail("pCutBest != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaMf.c"
                      ,0x655,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
      }
      if ((p->fUseEla == 0) || (*(uint *)&local_340->field_0xc < 0x10000)) {
        *(uint *)&local_340->field_0xc = *(uint *)&local_340->field_0xc & 0xffff;
        iVar5 = local_368;
      }
      else {
        iVar5 = Mf_CutRef_rec(p,(int *)pCut_00);
      }
      if (iVar5 < -1) {
        __assert_fail("Value1 >= Value2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaMf.c"
                      ,0x65a,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
      }
      if (p->fUseEla != 0) {
        Mf_CutFlow(p,(int *)pCut_00,(int *)&local_374);
        local_384 = local_374 & 0xffff;
      }
      *(short *)&pMVar2->field_0xc = (short)local_384;
      pMVar2->Flow = fVar3 / *(float *)((long)&p->pLfObjs->nFlowRefs + local_350);
      if (pCut_00 <= local_370) {
        __assert_fail("pCuts < pCut",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaMf.c"
                      ,0x2ef,"void Mf_ObjSetBestCut(int *, int *)");
      }
      if (__src < pCut_00) {
        uVar1 = *pCut_00;
        __n = ((long)pCut_00 - (long)__src) * 0x40000000 >> 0x1e & 0xfffffffffffffffc;
        local_358 = pCut_00;
        memcpy(local_338,__src,__n);
        memmove(__src,local_358,(ulong)(uVar1 & 0x1f) * 4 + 4);
        memcpy(__src + (ulong)(uVar1 & 0x1f) + 1,local_338,__n);
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void Mf_ManComputeMapping( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjComputeBestCut( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}